

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O0

MGT_DISK_INFO * GetDiskInfo(uint8_t *p,MGT_DISK_INFO *di)

{
  SamDosType SVar1;
  uint8_t *puVar2;
  string local_e8;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  string local_78;
  allocator local_41;
  string local_40 [32];
  uint8_t *local_20;
  MGT_DIR *dir;
  MGT_DISK_INFO *di_local;
  uint8_t *p_local;
  
  di->dir_tracks = 4;
  if (*(int *)(p + 0xe8) == 0x534f4442) {
    di->dos_type = BDOS;
  }
  else if ((p[0xd2] == '\0') || (p[0xd2] == 0xff)) {
    di->dos_type = SAMDOS;
  }
  else {
    di->dos_type = MasterDOS;
  }
  SVar1 = di->dos_type;
  dir = (MGT_DIR *)di;
  if (SVar1 != SAMDOS) {
    local_20 = p;
    di_local = (MGT_DISK_INFO *)p;
    if (SVar1 == MasterDOS) {
      di->dir_tracks = (uint)p[0xff] + di->dir_tracks;
      if (di->dir_tracks < 4) {
        di->dir_tracks = 4;
      }
      else if (0x27 < di->dir_tracks) {
        di->dir_tracks = 0x27;
      }
      di->serial_number = (uint)CONCAT11(p[0xfc],p[0xfd]);
      if (p[0xd2] != '*') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,(char *)(p + 0xd2),10,&local_41);
        std::__cxx11::string::operator=((string *)(dir->abName + 7),local_40);
        std::__cxx11::string::~string(local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        util::trim(&local_78,(string *)(dir->abName + 7));
        std::__cxx11::string::operator=((string *)(dir->abName + 7),(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
    else if ((SVar1 == BDOS) && (p[0xd2] != '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,(char *)(p + 0xd2),10,&local_99);
      std::__cxx11::string::operator=((string *)(dir->abName + 7),local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      puVar2 = local_20 + 0xfa;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,(char *)puVar2,6,&local_c1);
      std::__cxx11::string::operator+=((string *)(dir->abName + 7),local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      util::trim(&local_e8,(string *)(dir->abName + 7));
      std::__cxx11::string::operator=((string *)(dir->abName + 7),(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
  }
  return (MGT_DISK_INFO *)dir;
}

Assistant:

MGT_DISK_INFO* GetDiskInfo(const uint8_t* p, MGT_DISK_INFO& di)
{
    auto dir = reinterpret_cast<const MGT_DIR*>(p);

    // Assume 4 directory tracks until we discover otherwise
    di.dir_tracks = MGT_DIR_TRACKS;

    // Determine the disk/DOS type, as each has different capabilities
    if (!memcmp(dir->abBDOS, "BDOS", 4))
        di.dos_type = SamDosType::BDOS;
    else if (dir->abLabel[0] != 0x00 && dir->abLabel[0] != 0xff)
        di.dos_type = SamDosType::MasterDOS;
    else
        di.dos_type = SamDosType::SAMDOS;

    // Extract the remaining disk information from type-specific locations
    switch (di.dos_type)
    {
    case SamDosType::SAMDOS:
        // Nothing more to do for SAMDOS
        break;

    case SamDosType::MasterDOS:
        // Add on any extra directory tracks
        di.dir_tracks += dir->extra.bExtraDirTracks;

        // Ensure the track count is legal for MasterDOS
        if (di.dir_tracks < MGT_DIR_TRACKS)
            di.dir_tracks = MGT_DIR_TRACKS;
        else if (di.dir_tracks > 39)
            di.dir_tracks = 39;

        // 16-bit random value used as a disk serial number
        di.serial_number = (dir->extra.abSerial[0] << 8) | dir->extra.abSerial[1];

        // MasterDOS uses '*' for 'no label'
        if (dir->abLabel[0] != '*')
        {
            di.disk_label = std::string(reinterpret_cast<const char*>(dir->abLabel), sizeof(dir->abLabel));
            di.disk_label = util::trim(di.disk_label);
        }
        break;

    case SamDosType::BDOS:
        // BDOS uses a null for 'no label'
        if (dir->abLabel[0])
        {
            di.disk_label = std::string(reinterpret_cast<const char*>(&dir->abLabel), sizeof(dir->abLabel));
            di.disk_label += std::string(reinterpret_cast<const char*>(&dir->extra.bDirTag), sizeof(dir->szLabelExtra));
            di.disk_label = util::trim(di.disk_label);
        }
        break;
    }

    return &di;
}